

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O3

void emit_dht(j_compress_ptr cinfo,int index,boolean is_ac)

{
  undefined4 uVar1;
  JHUFF_TBL *pJVar2;
  jpeg_error_mgr *pjVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  int val;
  undefined1 auVar7 [13];
  JHUFF_TBL **ppJVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  val = index;
  ppJVar8 = cinfo->dc_huff_tbl_ptrs;
  if (is_ac != 0) {
    val = index + 0x10;
    ppJVar8 = cinfo->ac_huff_tbl_ptrs;
  }
  pJVar2 = ppJVar8[index];
  if (pJVar2 == (JHUFF_TBL *)0x0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x34;
    (pjVar3->msg_parm).i[0] = val;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (pJVar2->sent_table == 0) {
    emit_byte(cinfo,0xff);
    emit_byte(cinfo,0xc4);
    lVar9 = 0;
    iVar11 = 0;
    iVar13 = 0;
    iVar14 = 0;
    iVar15 = 0;
    do {
      uVar1 = *(undefined4 *)(pJVar2->bits + lVar9 + 1);
      uVar10 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar10;
      auVar4[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar5[8] = (char)((uint)uVar1 >> 0x10);
      auVar5._0_8_ = uVar10;
      auVar5[9] = 0;
      auVar5._10_3_ = auVar4._10_3_;
      auVar7._5_8_ = 0;
      auVar7._0_5_ = auVar5._8_5_;
      auVar6[4] = (char)((uint)uVar1 >> 8);
      auVar6._0_4_ = (int)uVar10;
      auVar6[5] = 0;
      auVar6._6_7_ = SUB137(auVar7 << 0x40,6);
      iVar11 = iVar11 + (int)uVar10;
      iVar13 = iVar13 + auVar6._4_4_;
      iVar14 = iVar14 + auVar5._8_4_;
      iVar15 = iVar15 + (uint)(uint3)(auVar4._10_3_ >> 0x10);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x10);
    uVar12 = iVar15 + iVar13 + iVar14 + iVar11;
    emit_byte(cinfo,uVar12 + 0x13 >> 8 & 0xff);
    emit_byte(cinfo,uVar12 + 0x13 & 0xff);
    emit_byte(cinfo,val);
    lVar9 = 0;
    do {
      emit_byte(cinfo,(uint)pJVar2->bits[lVar9 + 1]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x10);
    if (uVar12 != 0) {
      uVar10 = 0;
      do {
        emit_byte(cinfo,(uint)pJVar2->huffval[uVar10]);
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
    }
    pJVar2->sent_table = 1;
  }
  return;
}

Assistant:

LOCAL(void)
emit_dht (j_compress_ptr cinfo, int index, boolean is_ac)
/* Emit a DHT marker */
{
  JHUFF_TBL * htbl;
  int length, i;
  
  if (is_ac) {
    htbl = cinfo->ac_huff_tbl_ptrs[index];
    index += 0x10;		/* output index has AC bit set */
  } else {
    htbl = cinfo->dc_huff_tbl_ptrs[index];
  }

  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, index);
  
  if (! htbl->sent_table) {
    emit_marker(cinfo, M_DHT);
    
    length = 0;
    for (i = 1; i <= 16; i++)
      length += htbl->bits[i];
    
    emit_2bytes(cinfo, length + 2 + 1 + 16);
    emit_byte(cinfo, index);
    
    for (i = 1; i <= 16; i++)
      emit_byte(cinfo, htbl->bits[i]);
    
    for (i = 0; i < length; i++)
      emit_byte(cinfo, htbl->huffval[i]);
    
    htbl->sent_table = TRUE;
  }
}